

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

void __thiscall Ptex::v2_2::PtexReader::readLevel(PtexReader *this,int levelid,Level **level)

{
  reference pvVar1;
  vector<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_> *this_00;
  reference pvVar2;
  PtexReader *this_01;
  reference pvVar3;
  reference pvVar4;
  size_t amount;
  long *in_RDX;
  int in_ESI;
  PtexReader *in_RDI;
  FaceEdit *e;
  size_t size;
  size_t i;
  Level *newlevel;
  LevelInfo *l;
  AutoMutex locker;
  Mutex *in_stack_ffffffffffffff48;
  PtexReader *in_stack_ffffffffffffff50;
  reference pvVar5;
  FaceDataHeader *in_stack_ffffffffffffff58;
  FilePos FVar6;
  size_type sVar7;
  undefined4 in_stack_ffffffffffffff68;
  uint32_t uVar8;
  size_type local_60;
  int in_stack_ffffffffffffffac;
  Level *in_stack_ffffffffffffffb0;
  
  AutoLock<Ptex::v2_2::Mutex>::AutoLock
            ((AutoLock<Ptex::v2_2::Mutex> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (*in_RDX == 0) {
    pvVar1 = std::vector<Ptex::v2_2::LevelInfo,_std::allocator<Ptex::v2_2::LevelInfo>_>::operator[]
                       (&in_RDI->_levelinfo,(long)in_ESI);
    this_00 = (vector<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_> *)
              operator_new(0x48);
    Level::Level(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    std::vector<long,_std::allocator<long>_>::operator[](&in_RDI->_levelpos,(long)in_ESI);
    seek(in_stack_ffffffffffffff50,(FilePos)in_stack_ffffffffffffff48);
    pvVar2 = std::vector<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>::
             operator[](this_00,0);
    readZipBlock(in_RDI,pvVar2,pvVar1->levelheadersize,pvVar1->nfaces << 2);
    tell(in_RDI);
    uVar8 = pvVar1->nfaces;
    sVar7 = 0;
    this_01 = (PtexReader *)
              std::vector<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>::
              operator[](this_00,0);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)(this_00 + 1),sVar7);
    computeOffsets(this_01,CONCAT44(uVar8,in_stack_ffffffffffffff68),(int)(sVar7 >> 0x20),
                   in_stack_ffffffffffffff58,(FilePos *)in_stack_ffffffffffffff50);
    if (in_ESI == 0) {
      local_60 = 0;
      sVar7 = std::
              vector<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
              ::size(&in_RDI->_faceedits);
      for (; local_60 < sVar7; local_60 = local_60 + 1) {
        pvVar3 = std::
                 vector<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
                 ::operator[](&in_RDI->_faceedits,local_60);
        pvVar5 = pvVar3;
        pvVar2 = std::
                 vector<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>::
                 operator[](this_00,(long)pvVar3->faceid);
        pvVar2->data = (pvVar5->fdh).data;
        FVar6 = pvVar3->pos;
        pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                           ((vector<long,_std::allocator<long>_> *)(this_00 + 1),
                            (long)pvVar3->faceid);
        *pvVar4 = FVar6;
      }
    }
    *in_RDX = (long)this_00;
    amount = Level::memUsed((Level *)0x135e44);
    increaseMemUsed(in_RDI,amount);
  }
  AutoLock<Ptex::v2_2::Mutex>::~AutoLock((AutoLock<Ptex::v2_2::Mutex> *)0x135e72);
  return;
}

Assistant:

void PtexReader::readLevel(int levelid, Level*& level)
{
    // get read lock and make sure we still need to read
    AutoMutex locker(readlock);
    if (level) {
        return;
    }

    // go ahead and read the level
    LevelInfo& l = _levelinfo[levelid];

    // keep new level local until finished
    Level* newlevel = new Level(l.nfaces);
    seek(_levelpos[levelid]);
    readZipBlock(&newlevel->fdh[0], l.levelheadersize, FaceDataHeaderSize * l.nfaces);
    computeOffsets(tell(), l.nfaces, &newlevel->fdh[0], &newlevel->offsets[0]);

    // apply edits (if any) to level 0
    if (levelid == 0) {
        for (size_t i = 0, size = _faceedits.size(); i < size; i++) {
            FaceEdit& e = _faceedits[i];
            newlevel->fdh[e.faceid] = e.fdh;
            newlevel->offsets[e.faceid] = e.pos;
        }
    }

    // don't assign to result until level data is fully initialized
    AtomicStore(&level, newlevel);
    increaseMemUsed(level->memUsed());
}